

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.h
# Opt level: O0

void __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::BackgroundPageQueue::PushFreePageEntry(BackgroundPageQueue *this,FreePageEntry *entry)

{
  AutoCriticalSection local_20;
  AutoCriticalSection autoCS;
  FreePageEntry *entry_local;
  BackgroundPageQueue *this_local;
  
  autoCS.cs = (CriticalSection *)entry;
  AutoCriticalSection::AutoCriticalSection(&local_20,&this->backgroundPageQueueCriticalSection);
  *(FreePageEntry **)((autoCS.cs)->super_CCLock).mutexPtr = this->bgFreePageList;
  this->bgFreePageList = (FreePageEntry *)autoCS.cs;
  AutoCriticalSection::~AutoCriticalSection(&local_20);
  return;
}

Assistant:

void PushFreePageEntry(FreePageEntry* entry)
        {
#if SUPPORT_WIN32_SLIST
            ::InterlockedPushEntrySList(&bgFreePageList, entry);
#else
            AutoCriticalSection autoCS(&backgroundPageQueueCriticalSection);
            entry->Next = bgFreePageList;
            bgFreePageList = entry;
#endif
        }